

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kriging.cpp
# Opt level: O0

tuple<arma::Col<double>,_arma::Col<double>_> * __thiscall
Kriging::leaveOneOutVec(Kriging *this,vec *_theta)

{
  subview_col<double> *in_RSI;
  Mat<double> *in_RDI;
  mat yhat;
  double loo;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *in_stack_00001ed0;
  KModel *in_stack_00001ed8;
  mat *in_stack_00001ee0;
  vec *in_stack_00001ee8;
  vec *in_stack_00001ef0;
  Kriging *in_stack_00001ef8;
  tuple<arma::subview_col<double>,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>_>
  *in_stack_fffffffffffffd88;
  fill_class<arma::fill::fill_none> *in_stack_fffffffffffffd90;
  undefined1 state;
  Mat<double> *__args_1;
  undefined8 in_stack_fffffffffffffd98;
  Mat<double> *this_00;
  Mat<double> *in_m;
  undefined1 local_238 [48];
  eOp<arma::subview_col<double>,_arma::eop_scalar_times> local_208;
  undefined1 local_1c8 [176];
  Mat<double> local_118;
  double local_68;
  undefined4 local_44;
  Mat<double> *local_40;
  undefined1 *local_38;
  undefined4 local_2c;
  Mat<double> *local_28;
  undefined1 *local_20;
  double local_18;
  undefined1 *local_10;
  eOp<arma::subview_col<double>,_arma::eop_scalar_times> *local_8;
  
  local_68 = -1.0;
  in_m = in_RDI;
  arma::Mat<double>::Mat<arma::fill::fill_none>
            (in_RDI,(uword)((ulong)in_stack_fffffffffffffd98 >> 0x20),
             (uword)in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
  state = (undefined1)((ulong)in_stack_fffffffffffffd90 >> 0x38);
  local_68 = _leaveOneOut(in_stack_00001ef8,in_stack_00001ef0,in_stack_00001ee8,in_stack_00001ee0,
                          in_stack_00001ed8,in_stack_00001ed0);
  local_20 = local_1c8;
  this_00 = &local_118;
  local_2c = 0;
  local_28 = this_00;
  arma::arma_check_bounds<char[32]>((bool)state,(char (*) [32])in_stack_fffffffffffffd88);
  arma::subview_col<double>::subview_col(in_RSI,in_m,(uword)((ulong)in_RDI >> 0x20));
  local_38 = local_238;
  __args_1 = &local_118;
  local_44 = 1;
  local_40 = __args_1;
  arma::arma_check_bounds<char[32]>
            (SUB81((ulong)__args_1 >> 0x38,0),(char (*) [32])in_stack_fffffffffffffd88);
  arma::subview_col<double>::subview_col(in_RSI,in_m,(uword)((ulong)in_RDI >> 0x20));
  local_18 = sqrt(*(double *)&in_RSI[0x3a].super_subview<double>.aux_row1);
  local_8 = &local_208;
  local_10 = local_238;
  arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>::eOp
            ((eOp<arma::subview_col<double>,_arma::eop_scalar_times> *)in_RDI,
             (subview_col<double> *)this_00,(elem_type)__args_1);
  std::
  make_tuple<arma::subview_col<double>,arma::eOp<arma::subview_col<double>,arma::eop_scalar_times>const>
            ((subview_col<double> *)this_00,
             (eOp<arma::subview_col<double>,_arma::eop_scalar_times> *)__args_1);
  std::tuple<arma::Col<double>,_arma::Col<double>_>::
  tuple<arma::subview_col<double>,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>,_true>
            ((tuple<arma::Col<double>,_arma::Col<double>_> *)__args_1,in_stack_fffffffffffffd88);
  std::
  tuple<arma::subview_col<double>,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>_>::
  ~tuple((tuple<arma::subview_col<double>,_arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>_>
          *)0x1941a0);
  arma::eOp<arma::subview_col<double>,_arma::eop_scalar_times>::~eOp(&local_208);
  arma::subview_col<double>::~subview_col((subview_col<double> *)0x1941b4);
  arma::subview_col<double>::~subview_col((subview_col<double> *)0x1941c1);
  arma::Mat<double>::~Mat(this_00);
  return (tuple<arma::Col<double>,_arma::Col<double>_> *)in_m;
}

Assistant:

LIBKRIGING_EXPORT std::tuple<arma::vec, arma::vec> Kriging::leaveOneOutVec(const arma::vec& _theta) {
  double loo = -1;
  arma::mat yhat = arma::mat(m_y.n_elem, 2, arma::fill::none);
  loo = _leaveOneOut(_theta, nullptr, &yhat, nullptr, nullptr);

  return std::make_tuple(std::move(yhat.col(0)), std::move(yhat.col(1) * std::sqrt(m_sigma2)));
}